

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O2

void __thiscall GYMPlayer::RefreshTSRates(GYMPlayer *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  UINT64 UVar5;
  
  this->_ttMult = 1;
  uVar4 = (ulong)this->_tickFreq;
  uVar1 = (this->_playOpts).genOpts.pbSpeed;
  this->_tsDiv = uVar4;
  if ((uVar1 & 0xfffeffff) == 0) {
    lVar3 = 1;
  }
  else {
    this->_ttMult = 0x10000;
    uVar4 = uVar4 * uVar1;
    this->_tsDiv = uVar4;
    lVar3 = 0x10000;
  }
  UVar5 = (ulong)(this->super_PlayerBase)._outSmplRate * lVar3;
  this->_tsMult = UVar5;
  uVar2 = this->_lastTsMult;
  if ((UVar5 - uVar2 == 0) && (uVar4 == this->_lastTsDiv)) {
    return;
  }
  if ((uVar2 != 0) && (this->_lastTsDiv != 0)) {
    this->_playSmpl =
         (UINT32)((((this->_lastTsDiv * (ulong)this->_playSmpl) / uVar2) * UVar5) / uVar4);
  }
  this->_lastTsMult = UVar5;
  this->_lastTsDiv = uVar4;
  return;
}

Assistant:

void GYMPlayer::RefreshTSRates(void)
{
	_ttMult = 1;
	_tsDiv = _tickFreq;
	if (_playOpts.genOpts.pbSpeed != 0 && _playOpts.genOpts.pbSpeed != 0x10000)
	{
		_ttMult *= 0x10000;
		_tsDiv *= _playOpts.genOpts.pbSpeed;
	}
	_tsMult = _ttMult * _outSmplRate;
	if (_tsMult != _lastTsMult ||
	    _tsDiv != _lastTsDiv)
	{
		if (_lastTsMult && _lastTsDiv)	// the order * / * / is required to avoid overflow
			_playSmpl = (UINT32)(_playSmpl * _lastTsDiv / _lastTsMult * _tsMult / _tsDiv);
		_lastTsMult = _tsMult;
		_lastTsDiv = _tsDiv;
	}
	return;
}